

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O1

void __thiscall itis::SplayTree::prettyPrint(SplayTree *this,Node *vertex)

{
  ostream *poVar1;
  Node *pNVar2;
  Node *pNVar3;
  char *pcVar4;
  
LAB_00104550:
  do {
    pNVar3 = vertex;
    if (pNVar3 == (Node *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"empty tree",10);
      poVar1 = (ostream *)&std::cout;
    }
    else {
      if (pNVar3->left_child == (Node *)0x0) {
LAB_001045ee:
        pNVar2 = pNVar3->right_child;
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pNVar3->data);
        if (pNVar2 == (Node *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,": no children",0xd);
          goto LAB_0010462a;
        }
        pcVar4 = ": ";
LAB_00104614:
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,2);
        pNVar2 = pNVar3->right_child;
      }
      else {
        if (pNVar3->right_child != (Node *)0x0) {
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pNVar3->data);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,pNVar3->left_child->data);
          pcVar4 = ", ";
          goto LAB_00104614;
        }
        if (pNVar3->left_child == (Node *)0x0) goto LAB_001045ee;
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pNVar3->data);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
        pNVar2 = pNVar3->left_child;
      }
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,pNVar2->data);
    }
LAB_0010462a:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    vertex = pNVar3->left_child;
    if (vertex != (Node *)0x0) {
      if (pNVar3->right_child != (Node *)0x0) {
        prettyPrint(this,vertex);
        vertex = pNVar3->right_child;
        goto LAB_00104550;
      }
      if (vertex != (Node *)0x0) goto LAB_00104550;
    }
    vertex = pNVar3->right_child;
    if (pNVar3->right_child == (Node *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void SplayTree::prettyPrint(Node *vertex) {
    if (vertex == nullptr){
      std::cout << "empty tree" << std::endl;
    } else if (vertex->left_child != nullptr && vertex->right_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->left_child->data << ", " << vertex->right_child->data << std::endl;
    } else if (vertex->left_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->left_child->data << std::endl;
    } else if (vertex->right_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->right_child->data << std::endl;
    } else {
      std::cout << vertex->data << ": no children" << std::endl;
    }
    if (vertex->left_child != nullptr && vertex->right_child != nullptr) {
      prettyPrint(vertex->left_child);
      prettyPrint(vertex->right_child);
    } else if (vertex->left_child != nullptr) {
      prettyPrint(vertex->left_child);
    } else if (vertex->right_child != nullptr) {
      prettyPrint(vertex->right_child);
    }
  }